

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::_build_extra_shape
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,InputGraph *shape,bool injective,int count,bool pattern)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  uint w;
  uint uVar8;
  string_view l;
  string_view l_00;
  int seen_count;
  InputGraph master_graph;
  value_type nv;
  _List_node_base local_158;
  size_t local_148;
  _List_node_base local_140;
  undefined1 local_130 [16];
  bool local_120;
  PropagateUsingLackey local_11c;
  bool local_d0;
  HomomorphismResult child_result;
  
  InputGraph::InputGraph(&master_graph,size,true,false);
  for (uVar7 = 0; uVar7 != size; uVar7 = uVar7 + 1) {
    SVOBitset::SVOBitset
              (&nv,(graph_rows->
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar7);
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      bVar6 = SVOBitset::test(&nv,uVar8);
      if (bVar6) {
        InputGraph::add_edge(&master_graph,uVar7,uVar8);
      }
    }
    SVOBitset::~SVOBitset(&nv);
  }
  iVar2 = (injective ^ 1) * 2;
  uVar7 = 0;
  do {
    if ((uVar7 == size) ||
       (bVar6 = Timeout::should_abort
                          (*(Timeout **)
                            ((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl)->params), bVar6)) {
      if (pattern != false) {
        _Var1._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nv,"extra_shape",(allocator<char> *)&child_result);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(_Var1._M_head_impl)->supplemental_graph_names,(value_type *)&nv);
        std::__cxx11::string::~string((string *)&nv);
      }
      *idx = *idx + 1;
      InputGraph::~InputGraph(&master_graph);
      return;
    }
    uVar8 = 0;
    while ((uVar7 != uVar8 &&
           (bVar6 = Timeout::should_abort
                              (*(Timeout **)
                                ((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->params), !bVar6))) {
      nv._data.short_data[3]._4_4_ = 0;
      nv._data.short_data[4]._0_1_ = 0;
      nv._data.short_data[0xe] = (BitWord)(&nv._data.long_data + 0xe);
      local_158._M_next = &local_158;
      nv._data.short_data[5] = 0;
      nv._data.short_data[6] = 0;
      nv._data.short_data[7] = 0;
      nv._data.short_data[8] = 0;
      local_130 = ZEXT416(0) << 0x40;
      nv._data.short_data[2] = local_130._7_8_;
      nv._data.short_data[3]._0_1_ = 0;
      nv._data._0_9_ = local_130._0_9_;
      nv._data.short_data[1]._1_7_ = 0;
      nv._data.short_data[9]._0_4_ = 1;
      nv._data.short_data[10] = 0;
      nv._data.short_data[0xb] = 0x1ffffffff;
      nv._data.short_data[0xc]._0_4_ = 0x10000;
      nv._data.short_data[0xc]._4_1_ = 0;
      nv._data.short_data[0xc]._5_1_ = 0;
      nv._data.short_data[0xd]._0_4_ = 4;
      local_140._M_next = &local_140;
      nv.n_words = 0;
      nv._132_3_ = 0;
      stack0xfffffffffffffe9f = 0;
      local_148 = 0;
      local_11c = Never;
      local_d0 = false;
      local_120 = false;
      nv._data.short_data[0xf] = nv._data.short_data[0xe];
      local_158._M_prev = local_158._M_next;
      local_140._M_prev = local_140._M_next;
      std::__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)&nv,
                 (__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)
                 ((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->params);
      nv._data.short_data[2] =
           *(BitWord *)
            ((long)((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->params + 0x10);
      nv._data.short_data[3]._0_1_ = 0;
      std::make_unique<gss::NoRestartsSchedule>();
      uVar4 = nv._data.short_data[10];
      nv._data.short_data[10] = child_result.mapping._M_t._M_impl._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = child_result.mapping._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      child_result.mapping._M_t._M_impl._0_16_ = auVar3 << 0x40;
      if (uVar4 != 0) {
        (**(code **)(*(long *)uVar4 + 8))();
      }
      std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
      ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                   *)&child_result);
      uVar5 = nv._data.short_data[8];
      uVar4 = nv._data.short_data[7];
      seen_count = 0;
      nv._data.short_data[0xc]._2_1_ = 0;
      nv._data.short_data[0xc]._5_1_ = 1;
      nv._data.short_data[3]._4_4_ = iVar2;
      if (1 < count) {
        nv._data.short_data[4]._0_1_ = 1;
        child_result.mapping._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             nv._data.short_data[6];
        child_result.mapping._M_t._M_impl._0_8_ = nv._data.short_data[5];
        nv._data.short_data[5] = (BitWord)&seen_count;
        nv._data.short_data[6] = (BitWord)&count;
        nv._data.short_data[7] =
             (BitWord)std::
                      _Function_handler<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:1172:51)>
                      ::_M_manager;
        nv._data.short_data[8] =
             (BitWord)std::
                      _Function_handler<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:1172:51)>
                      ::_M_invoke;
        child_result.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)uVar4;
        child_result.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uVar5
        ;
        std::_Function_base::~_Function_base((_Function_base *)&child_result);
      }
      l._M_str = "from";
      l._M_len = 4;
      InputGraph::set_vertex_label(&master_graph,uVar7,l);
      l_00._M_str = "to";
      l_00._M_len = 2;
      InputGraph::set_vertex_label(&master_graph,uVar8,l_00);
      solve_homomorphism_problem(&child_result,shape,&master_graph,(HomomorphismParams *)&nv);
      if (count < 2) {
        if (child_result.mapping._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
        goto LAB_0012a0e8;
      }
      else if (count <= seen_count) {
LAB_0012a0e8:
        SVOBitset::set((graph_rows->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (this->max_graphs * uVar7 + *idx),uVar8);
        SVOBitset::set((graph_rows->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (this->max_graphs * uVar8 + *idx),uVar7);
      }
      InputGraph::set_vertex_label(&master_graph,uVar7,(string_view)(ZEXT816(0x1614cd) << 0x40));
      InputGraph::set_vertex_label(&master_graph,uVar8,(string_view)(ZEXT816(0x1614cd) << 0x40));
      HomomorphismResult::~HomomorphismResult(&child_result);
      HomomorphismParams::~HomomorphismParams((HomomorphismParams *)&nv);
      uVar8 = uVar8 + 1;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

auto HomomorphismModel::_build_extra_shape(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, InputGraph & shape,
    bool injective, int count, bool pattern) -> void
{
    InputGraph master_graph(size, true, false);

    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w))
                master_graph.add_edge(v, w);
        }
    }

    for (unsigned v = 0; v < size && ! _imp->params.timeout->should_abort(); ++v) {
        for (unsigned w = 0; w < v && ! _imp->params.timeout->should_abort(); ++w) {
            HomomorphismParams child_params;
            child_params.timeout = _imp->params.timeout;
            child_params.start_time = _imp->params.start_time;
            child_params.induced = false;
            child_params.restarts_schedule = make_unique<NoRestartsSchedule>();
            child_params.clique_detection = false;
            child_params.injectivity = injective ? Injectivity::Injective : Injectivity::NonInjective;
            child_params.no_supplementals = true;

            int seen_count = 0;
            if (count > 1) {
                child_params.count_solutions = true;
                child_params.enumerate_callback = [&](const VertexToVertexMapping &) {
                    return ++seen_count < count;
                };
            }

            master_graph.set_vertex_label(v, "from");
            master_graph.set_vertex_label(w, "to");
            auto child_result = solve_homomorphism_problem(shape, master_graph, child_params);
            if ((count > 1) ? seen_count >= count : ! child_result.mapping.empty()) {
                graph_rows[v * max_graphs + idx].set(w);
                graph_rows[w * max_graphs + idx].set(v);
            }
            master_graph.set_vertex_label(v, "");
            master_graph.set_vertex_label(w, "");
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("extra_shape");
    ++idx;
}